

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O2

int ecp_mod_koblitz(mbedtls_mpi *N,mbedtls_mpi_uint *Rp,size_t p_limbs,size_t adjust,size_t shift,
                   mbedtls_mpi_uint mask)

{
  int iVar1;
  ulong uVar2;
  mbedtls_mpi local_a8;
  mbedtls_mpi_uint local_90;
  size_t local_88;
  long local_80;
  ulong local_78;
  mbedtls_mpi R;
  mbedtls_mpi_uint Mp [5];
  
  iVar1 = 0;
  if (p_limbs <= N->n) {
    local_a8.s = 1;
    R.n = 1;
    local_a8.p = Mp;
    uVar2 = N->n - (p_limbs - adjust);
    local_78 = adjust + p_limbs;
    if (local_78 <= uVar2) {
      uVar2 = local_78;
    }
    Mp[0] = 0;
    Mp[1] = 0;
    Mp[2] = 0;
    Mp[3] = 0;
    Mp[4] = 0;
    local_80 = p_limbs * 8;
    local_a8.n = uVar2;
    local_90 = mask;
    local_88 = shift;
    R.s = local_a8.s;
    R.p = Rp;
    memcpy(local_a8.p,N->p + (p_limbs - adjust),uVar2 * 8);
    if ((local_88 == 0) ||
       (iVar1 = mbedtls_mpi_shift_r(&local_a8,local_88), uVar2 = local_a8.n, iVar1 == 0)) {
      local_a8.n = (uVar2 - adjust) + 1;
      uVar2 = p_limbs;
      if (local_90 != 0) {
        N->p[p_limbs - 1] = N->p[p_limbs - 1] & local_90;
      }
      for (; uVar2 < N->n; uVar2 = uVar2 + 1) {
        N->p[uVar2] = 0;
      }
      iVar1 = mbedtls_mpi_mul_mpi(&local_a8,&local_a8,&R);
      if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_add_abs(N,N,&local_a8), iVar1 == 0)) {
        uVar2 = N->n - (p_limbs - adjust);
        if (local_78 <= uVar2) {
          uVar2 = local_78;
        }
        Mp[0] = 0;
        Mp[1] = 0;
        Mp[2] = 0;
        Mp[3] = 0;
        Mp[4] = 0;
        local_a8.n = uVar2;
        memcpy(Mp,(void *)((long)N->p + adjust * -8 + local_80),uVar2 * 8);
        if ((local_88 == 0) ||
           (iVar1 = mbedtls_mpi_shift_r(&local_a8,local_88), uVar2 = local_a8.n, iVar1 == 0)) {
          local_a8.n = (R.n - adjust) + uVar2;
          if (local_90 != 0) {
            N->p[p_limbs - 1] = N->p[p_limbs - 1] & local_90;
          }
          for (; p_limbs < N->n; p_limbs = p_limbs + 1) {
            N->p[p_limbs] = 0;
          }
          iVar1 = mbedtls_mpi_mul_mpi(&local_a8,&local_a8,&R);
          if (iVar1 == 0) {
            iVar1 = mbedtls_mpi_add_abs(N,N,&local_a8);
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static inline int ecp_mod_koblitz( mbedtls_mpi *N, mbedtls_mpi_uint *Rp, size_t p_limbs,
                                   size_t adjust, size_t shift, mbedtls_mpi_uint mask )
{
    int ret;
    size_t i;
    mbedtls_mpi M, R;
    mbedtls_mpi_uint Mp[P_KOBLITZ_MAX + P_KOBLITZ_R];

    if( N->n < p_limbs )
        return( 0 );

    /* Init R */
    R.s = 1;
    R.p = Rp;
    R.n = P_KOBLITZ_R;

    /* Common setup for M */
    M.s = 1;
    M.p = Mp;

    /* M = A1 */
    M.n = N->n - ( p_limbs - adjust );
    if( M.n > p_limbs + adjust )
        M.n = p_limbs + adjust;
    memset( Mp, 0, sizeof Mp );
    memcpy( Mp, N->p + p_limbs - adjust, M.n * sizeof( mbedtls_mpi_uint ) );
    if( shift != 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &M, shift ) );
    M.n += R.n - adjust; /* Make room for multiplication by R */

    /* N = A0 */
    if( mask != 0 )
        N->p[p_limbs - 1] &= mask;
    for( i = p_limbs; i < N->n; i++ )
        N->p[i] = 0;

    /* N = A0 + R * A1 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &M, &M, &R ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_abs( N, N, &M ) );

    /* Second pass */

    /* M = A1 */
    M.n = N->n - ( p_limbs - adjust );
    if( M.n > p_limbs + adjust )
        M.n = p_limbs + adjust;
    memset( Mp, 0, sizeof Mp );
    memcpy( Mp, N->p + p_limbs - adjust, M.n * sizeof( mbedtls_mpi_uint ) );
    if( shift != 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &M, shift ) );
    M.n += R.n - adjust; /* Make room for multiplication by R */

    /* N = A0 */
    if( mask != 0 )
        N->p[p_limbs - 1] &= mask;
    for( i = p_limbs; i < N->n; i++ )
        N->p[i] = 0;

    /* N = A0 + R * A1 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &M, &M, &R ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_abs( N, N, &M ) );

cleanup:
    return( ret );
}